

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode Curl_cf_unix_create(Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,
                            int transport)

{
  CURLcode CVar1;
  int *__s;
  Curl_cfilter *pCVar2;
  Curl_cfilter *cf;
  Curl_cfilter *local_28;
  
  local_28 = (Curl_cfilter *)0x0;
  __s = (int *)(*Curl_ccalloc)(1,0x138);
  if (__s == (int *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    memset(__s,0,0x138);
    __s[0x26] = -1;
    *__s = transport;
    CVar1 = Curl_sock_assign_addr((Curl_sockaddr_ex *)(__s + 2),ai,transport);
    if (CVar1 == CURLE_OK) {
      CVar1 = Curl_cf_create(&local_28,&Curl_cft_unix,__s);
    }
  }
  pCVar2 = (Curl_cfilter *)0x0;
  if (CVar1 == CURLE_OK) {
    pCVar2 = local_28;
  }
  *pcf = pCVar2;
  if (CVar1 != CURLE_OK) {
    (*Curl_cfree)(local_28);
    local_28 = (Curl_cfilter *)0x0;
    (*Curl_cfree)(__s);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_unix_create(struct Curl_cfilter **pcf,
                             struct Curl_easy *data,
                             struct connectdata *conn,
                             const struct Curl_addrinfo *ai,
                             int transport)
{
  struct cf_socket_ctx *ctx = NULL;
  struct Curl_cfilter *cf = NULL;
  CURLcode result;

  (void)data;
  (void)conn;
  DEBUGASSERT(transport == TRNSPRT_UNIX);
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = cf_socket_ctx_init(ctx, ai, transport);
  if(result)
    goto out;

  result = Curl_cf_create(&cf, &Curl_cft_unix, ctx);

out:
  *pcf = (!result) ? cf : NULL;
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }

  return result;
}